

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::getQuadratureWeights<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *weights)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer piVar4;
  Data2D<int> *pDVar5;
  int *piVar6;
  ulong uVar7;
  Data2D<int> *pDVar8;
  int i;
  ulong uVar9;
  int j;
  MultiIndexSet *mset;
  long lVar10;
  size_type sVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar18;
  bool local_131;
  uint local_130;
  allocator_type local_129;
  uint local_128;
  int local_124;
  long local_120;
  size_type local_118;
  vector<bool,_std::allocator<bool>_> used;
  Data2D<int> lparents;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  
  mset = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    mset = &(this->super_BaseCanonicalGrid).needed;
  }
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x23])();
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_count,(long)this->top_level + 1,
             (allocator_type *)&lparents);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_tail,(long)this->top_level + 1,
             (allocator_type *)&lparents);
  lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lparents.stride = 0;
  lparents.num_strips = 0;
  lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_130 = (uint)(this->parents).num_strips;
  local_128 = local_130;
  if (mset->cache_num_indexes != local_130) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>((Data2D<int> *)&used,mset);
    Data2D<int>::operator=(&lparents,(Data2D<int> *)&used);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               &used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish);
    local_128 = (uint)(this->parents).num_strips;
    local_130 = mset->cache_num_indexes;
  }
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)4>
            ((vector<int,_std::allocator<int>_> *)&level,mset);
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&node,(long)iVar1,(allocator_type *)&used);
  local_131 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&used,(long)mset->cache_num_indexes,&local_131,
             &local_129);
  iVar15 = this->top_level;
  uVar7 = 0;
  if (0 < (int)local_130) {
    uVar7 = (ulong)local_130;
  }
  do {
    if (iVar15 < 1) {
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                ((_Bvector_base<std::allocator<bool>_> *)&used);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&node);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&level);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lparents.vec.super__Vector_base<int,_std::allocator<int>_>);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
      return;
    }
    lVar10 = 0;
    local_124 = iVar15;
    for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      if (level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] == iVar15) {
        sVar3 = mset->num_dimensions;
        piVar4 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_120 = lVar10;
        for (lVar13 = 0; lVar13 < (this->super_BaseCanonicalGrid).num_dimensions;
            lVar13 = lVar13 + 1) {
          dVar16 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)4>
                             (*(int *)((long)piVar4 + lVar13 * 4 + sVar3 * lVar10));
          node.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = dVar16;
        }
        local_131 = false;
        __first.super__Bit_iterator_base._8_8_ = 0;
        __first.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
        __last.super__Bit_iterator_base._M_offset =
             used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
        std::__fill_a1(__first,__last,&local_131);
        *monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = 0;
        *monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)uVar9;
        uVar14 = 0;
        piVar6 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = local_124;
        do {
          uVar14 = (ulong)(int)uVar14;
          while( true ) {
            lVar10 = local_120;
            if (SBORROW4(*piVar6,iVar1 * 2) == *piVar6 + iVar1 * -2 < 0) goto LAB_00195381;
            iVar2 = piVar6[uVar14];
            if (SBORROW4(iVar2,iVar1 * 2) != iVar2 + iVar1 * -2 < 0) break;
            uVar14 = uVar14 - 1;
            piVar6[(int)uVar14] = piVar6[(int)uVar14] + 1;
          }
          pDVar8 = &lparents;
          if (local_130 == local_128) {
            pDVar8 = &this->parents;
          }
          pDVar5 = &lparents;
          if (local_130 == local_128) {
            pDVar5 = &this->parents;
          }
          sVar11 = (size_type)
                   (pDVar5->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(long)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar14] * pDVar8->stride + (long)iVar2];
          if ((sVar11 == 0xffffffffffffffff) ||
             (local_118 = sVar11,
             rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&used,sVar11),
             piVar6 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, (*rVar18._M_p & rVar18._M_mask) != 0)) {
            piVar6[uVar14] = piVar6[uVar14] + 1;
          }
          else {
            lVar13 = mset->num_dimensions * local_118;
            piVar4 = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar16 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                               (this->order,piVar4[lVar13],
                                *node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
            for (lVar10 = 1; sVar11 = local_118,
                lVar10 < (this->super_BaseCanonicalGrid).num_dimensions; lVar10 = lVar10 + 1) {
              dVar17 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>
                                 (this->order,piVar4[lVar13 + lVar10],
                                  node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar10]);
              dVar16 = dVar16 * dVar17;
            }
            weights[local_118] = weights[local_118] - dVar16 * weights[uVar9];
            rVar18 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&used,local_118);
            *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
            uVar12 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar12;
            monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar12] = 0;
            monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar12] = (int)sVar11;
            piVar6 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = local_124;
          }
        } while( true );
      }
LAB_00195381:
      lVar10 = lVar10 + 4;
    }
    iVar15 = iVar15 + -1;
  } while( true );
}

Assistant:

void GridLocalPolynomial::getQuadratureWeights(double *weights) const{
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    integrateHierarchicalFunctions(weights);

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);

    double basis_value;

    Data2D<int> lparents;
    if (parents.getNumStrips() != work.getNumIndexes())
        lparents = HierarchyManipulations::computeDAGup<effrule>(work);

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    int num_points = work.getNumIndexes();
    std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(work);

    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);
    std::vector<bool> used(work.getNumIndexes(), false);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);
                            weights[branch] -= weights[i] * basis_value;
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}